

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadObjectRec(BCReaderState *s)

{
  JSContext *ctx_00;
  long lVar1;
  BOOL BVar2;
  int iVar3;
  uint32_t *pval;
  undefined8 *in_RDI;
  JSValue JVar4;
  uint32_t val_1;
  JSString *p;
  JSFloat64Union u;
  int32_t val;
  JSValue obj;
  uint8_t tag;
  JSContext *ctx;
  BCReaderState *in_stack_fffffffffffffe48;
  JSRuntime *in_stack_fffffffffffffe50;
  BCReaderState *in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe68 [16];
  uint local_184;
  JSValueUnion local_180;
  int64_t local_178;
  BCReaderState *in_stack_fffffffffffffe90;
  int64_t local_168;
  BCReaderState *in_stack_fffffffffffffea0;
  int64_t local_158;
  undefined1 in_stack_fffffffffffffeb0 [16];
  BCReaderState *in_stack_fffffffffffffec0;
  int64_t local_138;
  BCReaderState *in_stack_fffffffffffffed0;
  int64_t local_128;
  JSValueUnion local_120;
  int64_t local_118;
  JSValueUnion local_110;
  int64_t local_108;
  JSValueUnion local_100;
  int64_t local_f8;
  BCReaderState *in_stack_ffffffffffffff10;
  int64_t local_d0;
  double local_c8;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uStack_94;
  uint uStack_84;
  JSValueUnion local_78;
  int64_t local_70;
  byte local_61;
  JSValueUnion local_50;
  int64_t local_48;
  undefined4 uStack_2c;
  undefined4 uStack_c;
  
  ctx_00 = (JSContext *)*in_RDI;
  BVar2 = js_check_stack_overflow(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
  if (BVar2 != 0) {
    JVar4 = JS_ThrowStackOverflow((JSContext *)0x144e27);
    return JVar4;
  }
  iVar3 = bc_get_u8(in_stack_fffffffffffffe48,(uint8_t *)0x144e51);
  lVar1 = local_50;
  if (iVar3 != 0) {
    local_50.ptr = (void *)(lVar1 << 0x20);
    local_48 = 6;
    return _local_50;
  }
  pval = (uint32_t *)(ulong)(local_61 - 1);
  switch(pval) {
  case (uint32_t *)0x0:
    local_78.ptr = (void *)((ulong)uStack_84 << 0x20);
    local_70 = 2;
    break;
  case (uint32_t *)0x1:
    local_78.ptr = (void *)((ulong)uStack_94 << 0x20);
    local_70 = 3;
    break;
  case (uint32_t *)0x2:
  case (uint32_t *)0x3:
    local_78.int32._1_3_ = 0;
    local_78.int32._0_1_ = local_61 != 3;
    local_78._4_4_ = uStack_c;
    local_70 = 1;
    break;
  case (uint32_t *)0x4:
    iVar3 = bc_get_sleb128(in_stack_fffffffffffffe58,(int32_t *)pval);
    if (iVar3 != 0) {
      local_50.ptr = (void *)(lVar1 << 0x20);
      local_48 = 6;
      return _local_50;
    }
    local_78._4_4_ = uStack_2c;
    local_78.int32 = in_stack_ffffffffffffff54;
    local_70 = 0;
    break;
  case (uint32_t *)0x5:
    iVar3 = bc_get_u64(in_stack_fffffffffffffe48,(uint64_t *)0x14506a);
    if (iVar3 != 0) {
      local_50.ptr = (void *)(lVar1 << 0x20);
      local_48 = 6;
      return _local_50;
    }
    JVar4 = __JS_NewFloat64(ctx_00,local_c8);
    local_78 = JVar4.u;
    local_d0 = JVar4.tag;
    local_70 = local_d0;
    break;
  case (uint32_t *)0x6:
    local_78.ptr = JS_ReadString(in_stack_fffffffffffffe68._0_8_);
    if ((JSString *)local_78.ptr == (JSString *)0x0) {
      local_50.ptr = (void *)(lVar1 << 0x20);
      local_48 = 6;
      return _local_50;
    }
    local_70 = -7;
    break;
  case (uint32_t *)0x7:
    JVar4 = JS_ReadObjectTag(in_stack_fffffffffffffeb0._0_8_);
    local_120 = JVar4.u;
    local_78 = local_120;
    local_118 = JVar4.tag;
    local_70 = local_118;
    break;
  case (uint32_t *)0x8:
  case (uint32_t *)0xc:
    JVar4 = JS_ReadArray(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb0._12_4_);
    local_78 = JVar4.u;
    local_128 = JVar4.tag;
    local_70 = local_128;
    break;
  default:
LAB_001454fb:
    JVar4 = JS_ThrowSyntaxError(ctx_00,"invalid tag (tag=%d pos=%u)",(ulong)local_61,
                                (ulong)(uint)((int)in_RDI[2] - (int)in_RDI[1]));
    return JVar4;
  case (uint32_t *)0xd:
    if ((*(int *)((long)in_RDI + 0x34) << 0x10) >> 0x18 == 0) goto LAB_001454fb;
    JVar4 = JS_ReadFunctionTag((BCReaderState *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_100 = JVar4.u;
    local_78 = local_100;
    local_f8 = JVar4.tag;
    local_70 = local_f8;
    break;
  case (uint32_t *)0xe:
    if ((*(int *)((long)in_RDI + 0x34) << 0x10) >> 0x18 == 0) goto LAB_001454fb;
    JVar4 = JS_ReadModule(in_stack_fffffffffffffed0);
    local_110 = JVar4.u;
    local_78 = local_110;
    local_108 = JVar4.tag;
    local_70 = local_108;
    break;
  case (uint32_t *)0xf:
    JVar4 = JS_ReadTypedArray(in_stack_ffffffffffffff10);
    local_78 = JVar4.u;
    local_138 = JVar4.tag;
    local_70 = local_138;
    break;
  case (uint32_t *)0x10:
    JVar4 = JS_ReadArrayBuffer(in_stack_fffffffffffffe68._8_8_);
    local_78 = JVar4.u;
    local_70 = JVar4.tag;
    break;
  case (uint32_t *)0x11:
    if (((char)*(undefined4 *)((long)in_RDI + 0x34) == '\0') ||
       ((ctx_00->rt->sab_funcs).sab_dup == (_func_void_void_ptr_void_ptr *)0x0)) goto LAB_001454fb;
    JVar4 = JS_ReadSharedArrayBuffer(in_stack_fffffffffffffeb0._0_8_);
    local_78 = JVar4.u;
    local_158 = JVar4.tag;
    local_70 = local_158;
    break;
  case (uint32_t *)0x12:
    JVar4 = JS_ReadDate(in_stack_fffffffffffffea0);
    local_78 = JVar4.u;
    local_168 = JVar4.tag;
    local_70 = local_168;
    break;
  case (uint32_t *)0x13:
    JVar4 = JS_ReadObjectValue(in_stack_fffffffffffffe90);
    local_180 = JVar4.u;
    local_78 = local_180;
    local_178 = JVar4.tag;
    local_70 = local_178;
    break;
  case (uint32_t *)0x14:
    if (*(int *)((long)in_RDI + 0x34) >> 0x18 == 0) {
      JVar4 = JS_ThrowSyntaxError(ctx_00,"object references are not allowed");
      return JVar4;
    }
    iVar3 = bc_get_leb128(in_stack_fffffffffffffe58,pval);
    if (iVar3 != 0) {
      local_50.ptr = (void *)(lVar1 << 0x20);
      local_48 = 6;
      return _local_50;
    }
    if (*(uint *)(in_RDI + 8) <= local_184) {
      JVar4 = JS_ThrowSyntaxError(ctx_00,"invalid object reference (%u >= %u)",(ulong)local_184,
                                  (ulong)*(uint *)(in_RDI + 8));
      return JVar4;
    }
    JVar4.tag = -1;
    JVar4.u.ptr = ((JSValueUnion *)(in_RDI[7] + (ulong)local_184 * 8))->ptr;
    JVar4 = JS_DupValue(ctx_00,JVar4);
    local_78 = JVar4.u;
    local_70 = JVar4.tag;
  }
  local_48 = local_70;
  local_50.float64 = local_78.float64;
  return _local_50;
}

Assistant:

static JSValue JS_ReadObjectRec(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    uint8_t tag;
    JSValue obj = JS_UNDEFINED;

    if (js_check_stack_overflow(ctx->rt, 0))
        return JS_ThrowStackOverflow(ctx);

    if (bc_get_u8(s, &tag))
        return JS_EXCEPTION;

    bc_read_trace(s, "%s {\n", bc_tag_str[tag]);

    switch(tag) {
    case BC_TAG_NULL:
        obj = JS_NULL;
        break;
    case BC_TAG_UNDEFINED:
        obj = JS_UNDEFINED;
        break;
    case BC_TAG_BOOL_FALSE:
    case BC_TAG_BOOL_TRUE:
        obj = JS_NewBool(ctx, tag - BC_TAG_BOOL_FALSE);
        break;
    case BC_TAG_INT32:
        {
            int32_t val;
            if (bc_get_sleb128(s, &val))
                return JS_EXCEPTION;
            bc_read_trace(s, "%d\n", val);
            obj = JS_NewInt32(ctx, val);
        }
        break;
    case BC_TAG_FLOAT64:
        {
            JSFloat64Union u;
            if (bc_get_u64(s, &u.u64))
                return JS_EXCEPTION;
            bc_read_trace(s, "%g\n", u.d);
            obj = __JS_NewFloat64(ctx, u.d);
        }
        break;
    case BC_TAG_STRING:
        {
            JSString *p;
            p = JS_ReadString(s);
            if (!p)
                return JS_EXCEPTION;
            obj = JS_MKPTR(JS_TAG_STRING, p);
        }
        break;
    case BC_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        obj = JS_ReadFunctionTag(s);
        break;
    case BC_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        obj = JS_ReadModule(s);
        break;
    case BC_TAG_OBJECT:
        obj = JS_ReadObjectTag(s);
        break;
    case BC_TAG_ARRAY:
    case BC_TAG_TEMPLATE_OBJECT:
        obj = JS_ReadArray(s, tag);
        break;
    case BC_TAG_TYPED_ARRAY:
        obj = JS_ReadTypedArray(s);
        break;
    case BC_TAG_ARRAY_BUFFER:
        obj = JS_ReadArrayBuffer(s);
        break;
    case BC_TAG_SHARED_ARRAY_BUFFER:
        if (!s->allow_sab || !ctx->rt->sab_funcs.sab_dup)
            goto invalid_tag;
        obj = JS_ReadSharedArrayBuffer(s);
        break;
    case BC_TAG_DATE:
        obj = JS_ReadDate(s);
        break;
    case BC_TAG_OBJECT_VALUE:
        obj = JS_ReadObjectValue(s);
        break;
#ifdef CONFIG_BIGNUM
    case BC_TAG_BIG_INT:
    case BC_TAG_BIG_FLOAT:
    case BC_TAG_BIG_DECIMAL:
        obj = JS_ReadBigNum(s, tag);
        break;
#endif
    case BC_TAG_OBJECT_REFERENCE:
        {
            uint32_t val;
            if (!s->allow_reference)
                return JS_ThrowSyntaxError(ctx, "object references are not allowed");
            if (bc_get_leb128(s, &val))
                return JS_EXCEPTION;
            bc_read_trace(s, "%u\n", val);
            if (val >= s->objects_count) {
                return JS_ThrowSyntaxError(ctx, "invalid object reference (%u >= %u)",
                                           val, s->objects_count);
            }
            obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, s->objects[val]));
        }
        break;
    default:
    invalid_tag:
        return JS_ThrowSyntaxError(ctx, "invalid tag (tag=%d pos=%u)",
                                   tag, (unsigned int)(s->ptr - s->buf_start));
    }
    bc_read_trace(s, "}\n");
    return obj;
}